

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLText::ParseDeep(XMLText *this,char *p,StrPair *param_2)

{
  XMLDocument *pXVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (this->_isCData == true) {
    pcVar2 = StrPair::ParseText(&(this->super_XMLNode)._value,p,"]]>",2);
    if (pcVar2 == (char *)0x0) {
      pXVar1 = (this->super_XMLNode)._document;
      pXVar1->_errorID = XML_ERROR_PARSING_CDATA;
      pXVar1->_errorStr1 = p;
      pXVar1->_errorStr2 = (char *)0x0;
    }
  }
  else {
    pXVar1 = (this->super_XMLNode)._document;
    pcVar3 = StrPair::ParseText(&(this->super_XMLNode)._value,p,"<",
                                (uint)pXVar1->_processEntities +
                                (uint)(pXVar1->_whitespace == COLLAPSE_WHITESPACE) * 4 + 2);
    if (pcVar3 == (char *)0x0) {
      pXVar1 = (this->super_XMLNode)._document;
      pXVar1->_errorID = XML_ERROR_PARSING_TEXT;
      pXVar1->_errorStr1 = p;
      pXVar1->_errorStr2 = (char *)0x0;
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = (char *)0x0;
      if (*pcVar3 != '\0') {
        pcVar2 = pcVar3 + -1;
      }
    }
  }
  return pcVar2;
}

Assistant:

char* XMLText::ParseDeep( char* p, StrPair* )
{
    const char* start = p;
    if ( this->CData() ) {
        p = _value.ParseText( p, "]]>", StrPair::NEEDS_NEWLINE_NORMALIZATION );
        if ( !p ) {
            _document->SetError( XML_ERROR_PARSING_CDATA, start, 0 );
        }
        return p;
    }
    else {
        int flags = _document->ProcessEntities() ? StrPair::TEXT_ELEMENT : StrPair::TEXT_ELEMENT_LEAVE_ENTITIES;
        if ( _document->WhitespaceMode() == COLLAPSE_WHITESPACE ) {
            flags |= StrPair::NEEDS_WHITESPACE_COLLAPSING;
        }

        p = _value.ParseText( p, "<", flags );
        if ( p && *p ) {
            return p-1;
        }
        if ( !p ) {
            _document->SetError( XML_ERROR_PARSING_TEXT, start, 0 );
        }
    }
    return 0;
}